

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

int __thiscall ON_Brep::AddTrimCurve(ON_Brep *this,ON_Curve *pC)

{
  int iVar1;
  ON_Curve *pC_local;
  
  iVar1 = -1;
  if (pC != (ON_Curve *)0x0) {
    pC_local = pC;
    iVar1 = (*(pC->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])(pC);
    if (iVar1 != 2) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep.cpp"
                 ,0x728,"","ON_Brep::AddTrimCurve() go a non-2d curve - changing dim to 2.");
      (*(pC->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(pC,2);
      iVar1 = (*(pC->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])(pC);
      if (iVar1 != 2) {
        return -1;
      }
    }
    iVar1 = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count;
    ON_SimpleArray<ON_Curve_*>::Append(&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,&pC_local);
  }
  return iVar1;
}

Assistant:

int 
ON_Brep::AddTrimCurve( ON_Curve* pC )
{
  int c2i = -1;

  if ( 0 != pC )
  {
    // 7 April 2003 Dale Lear:
    //    There are too many cases where bugs are caused by
    //    people attempting to use 3d curves for trims.  In
    //    all the cases encountered so far, the intent was
    //    to pass in a 2d curve, so...

    int dim = pC->Dimension();

    if ( dim != 2 )
    {
      ON_ERROR("ON_Brep::AddTrimCurve() go a non-2d curve - changing dim to 2.");
      pC->ChangeDimension(2);
      dim = pC->Dimension();
    }

    if ( 2 == dim )
    {
      c2i = m_C2.Count();
      m_C2.Append(pC);
    }
  }
  return c2i;
}